

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

bool CheckMinimalPush(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,opcodetype opcode)

{
  long lVar1;
  size_type sVar2;
  const_reference pvVar3;
  byte *pbVar4;
  ulong uVar5;
  uint in_ESI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd8;
  bool local_1d;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1d = 0x4e < in_ESI;
  if (local_1d) {
    __assert_fail("0 <= opcode && opcode <= OP_PUSHDATA4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/script.cpp"
                  ,0x170,"bool CheckMinimalPush(const std::vector<unsigned char> &, opcodetype)");
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (in_stack_ffffffffffffffc8);
  if (sVar2 == 0) {
    local_9 = in_ESI == 0;
  }
  else {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (in_stack_ffffffffffffffc8);
    if (((sVar2 == 1) &&
        (pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (in_stack_ffffffffffffffd8,
                             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0)),
        *pvVar3 != '\0')) &&
       (pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (in_stack_ffffffffffffffd8,
                            CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0)),
       *pbVar4 < 0x11)) {
      local_9 = false;
    }
    else {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (in_stack_ffffffffffffffc8);
      if ((sVar2 == 1) &&
         (pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (in_stack_ffffffffffffffd8,
                              CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0)),
         *pvVar3 == 0x81)) {
        local_9 = false;
      }
      else {
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (in_stack_ffffffffffffffc8);
        if (sVar2 < 0x4c) {
          uVar5 = (ulong)in_ESI;
          sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (in_stack_ffffffffffffffc8);
          local_9 = uVar5 == sVar2;
        }
        else {
          sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (in_stack_ffffffffffffffc8);
          if (sVar2 < 0x100) {
            local_9 = in_ESI == 0x4c;
          }
          else {
            sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              (in_stack_ffffffffffffffc8);
            if (sVar2 < 0x10000) {
              local_9 = in_ESI == 0x4d;
            }
            else {
              local_9 = true;
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckMinimalPush(const std::vector<unsigned char>& data, opcodetype opcode) {
    // Excludes OP_1NEGATE, OP_1-16 since they are by definition minimal
    assert(0 <= opcode && opcode <= OP_PUSHDATA4);
    if (data.size() == 0) {
        // Should have used OP_0.
        return opcode == OP_0;
    } else if (data.size() == 1 && data[0] >= 1 && data[0] <= 16) {
        // Should have used OP_1 .. OP_16.
        return false;
    } else if (data.size() == 1 && data[0] == 0x81) {
        // Should have used OP_1NEGATE.
        return false;
    } else if (data.size() <= 75) {
        // Must have used a direct push (opcode indicating number of bytes pushed + those bytes).
        return opcode == data.size();
    } else if (data.size() <= 255) {
        // Must have used OP_PUSHDATA.
        return opcode == OP_PUSHDATA1;
    } else if (data.size() <= 65535) {
        // Must have used OP_PUSHDATA2.
        return opcode == OP_PUSHDATA2;
    }
    return true;
}